

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTInflateMap.cpp
# Opt level: O3

void __thiscall
TTD::TTDCompareMap::GetCompareValues
          (TTDCompareMap *this,TTDCompareTag compareTag,TTD_PTR_ID h1PtrId,uint64 *val1,
          TTD_PTR_ID h2PtrId,uint64 *val2)

{
  unsigned_long uVar1;
  ulong uVar2;
  TTD_PTR_ID local_38;
  TTD_PTR_ID h1PtrId_local;
  TTD_PTR_ID h2PtrId_local;
  
  local_38 = h1PtrId;
  h1PtrId_local = h2PtrId;
  if (compareTag - TopLevelLoadFunction < 3) {
    uVar2 = (ulong)((compareTag - TopLevelLoadFunction) * 0x38);
    uVar1 = JsUtil::
            BaseDictionary<unsigned_long,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::Item((BaseDictionary<unsigned_long,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                    *)((long)&(this->H1FunctionTopLevelLoadMap).buckets + uVar2),&local_38);
    *val1 = uVar1;
    uVar1 = JsUtil::
            BaseDictionary<unsigned_long,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::Item((BaseDictionary<unsigned_long,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                    *)((long)&(this->H2FunctionTopLevelLoadMap).buckets + uVar2),&h1PtrId_local);
    *val2 = uVar1;
    return;
  }
  TTDAbort_unrecoverable_error("Should be a type");
}

Assistant:

void TTDCompareMap::GetCompareValues(TTDCompareTag compareTag, TTD_PTR_ID h1PtrId, uint64* val1, TTD_PTR_ID h2PtrId, uint64* val2)
    {
        if(compareTag == TTDCompareTag::TopLevelLoadFunction)
        {
            *val1 = this->H1FunctionTopLevelLoadMap.Item(h1PtrId);
            *val2 = this->H2FunctionTopLevelLoadMap.Item(h2PtrId);
        }
        else if(compareTag == TTDCompareTag::TopLevelNewFunction)
        {
            *val1 = this->H1FunctionTopLevelNewMap.Item(h1PtrId);
            *val2 = this->H2FunctionTopLevelNewMap.Item(h2PtrId);
        }
        else
        {
            TTDAssert(compareTag == TTDCompareTag::TopLevelEvalFunction, "Should be a type");
            *val1 = this->H1FunctionTopLevelEvalMap.Item(h1PtrId);
            *val2 = this->H2FunctionTopLevelEvalMap.Item(h2PtrId);
        }
    }